

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

boolean undiscovered_artifact(xchar m)

{
  int local_10;
  int i;
  xchar m_local;
  
  local_10 = 0;
  while( true ) {
    if (0x23 < local_10) {
      return '\x01';
    }
    if (artidisco[local_10] == m) break;
    if (artidisco[local_10] == '\0') {
      return '\x01';
    }
    local_10 = local_10 + 1;
  }
  return '\0';
}

Assistant:

boolean undiscovered_artifact(xchar m)
{
    int i;

    /* look for this artifact in the discoveries list;
       if we hit an empty slot then it's undiscovered */
    for (i = 0; i < NROFARTIFACTS; i++)
	if (artidisco[i] == m)
	    return FALSE;
	else if (artidisco[i] == 0)
	    break;
    return TRUE;
}